

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
           *this,undefined8 *state,long *next)

{
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
  sVar1;
  ushort uVar2;
  int iVar3;
  undefined8 uVar4;
  char cVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  
  uVar4 = *state;
  iVar3 = *(int *)(this + 4);
  if (iVar3 != 0) {
    pbVar6 = (byte *)*state;
    sVar1 = *this;
    uVar2 = *(ushort *)(this + 2);
    iVar7 = iVar3;
    do {
      if (pbVar6 == (byte *)state[4]) goto LAB_00135a7c;
      if (sVar1 == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
                    )((*(ushort *)(state[10] + 0x10 + (ulong)*pbVar6 * 2) & uVar2) != 0))
      goto LAB_00135a80;
      pbVar6 = pbVar6 + 1;
      *state = pbVar6;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  cVar5 = (**(code **)(*next + 0x10))(next,state);
  if (cVar5 == '\0') {
    uVar8 = iVar3 - 1;
    do {
      uVar8 = uVar8 + 1;
      if (*(uint *)(this + 8) <= uVar8) goto LAB_00135a80;
      pbVar6 = (byte *)*state;
      if (pbVar6 == (byte *)state[4]) goto LAB_00135a7c;
      if (*this == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
                    )((*(ushort *)(this + 2) & *(ushort *)(state[10] + 0x10 + (ulong)*pbVar6 * 2))
                     != 0)) goto LAB_00135a80;
      *state = pbVar6 + 1;
      cVar5 = (**(code **)(*next + 0x10))(next,state);
    } while (cVar5 == '\0');
  }
  return true;
LAB_00135a7c:
  *(undefined1 *)((long)state + 0x31) = 1;
LAB_00135a80:
  *state = uVar4;
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }